

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBodyEasy.cpp
# Opt level: O2

void __thiscall
chrono::ChBodyEasyBox::SetupBody
          (ChBodyEasyBox *this,double Xsize,double Ysize,double Zsize,double density,bool visualize,
          bool collide,shared_ptr<chrono::ChMaterialSurface> *material)

{
  shared_ptr<chrono::collision::ChCollisionModel> *psVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined7 in_register_00000011;
  undefined1 auVar5 [16];
  undefined8 in_XMM0_Qb;
  undefined8 in_XMM1_Qb;
  shared_ptr<chrono::ChVisualModel> vmodel;
  shared_ptr<chrono::ChVisualShape> local_138;
  shared_ptr<chrono::ChBoxShape> vshape;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_118;
  __shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2> local_108;
  ChVector<double> local_f8;
  ChQuaternion<double> local_d8;
  ChFrame<double> local_b0;
  
  dVar2 = Xsize * Ysize * Zsize * density;
  (this->super_ChBody).density = (float)density;
  ChVariablesBodyOwnMass::SetBodyMass(&(this->super_ChBody).variables,dVar2);
  dVar2 = dVar2 * 0.08333333333333333;
  local_b0._vptr_ChFrame = (_func_int **)((Ysize * Ysize + Zsize * Zsize) * dVar2);
  local_b0.coord.pos.m_data[0] = (Xsize * Xsize + Zsize * Zsize) * dVar2;
  local_b0.coord.pos.m_data[1] = (Xsize * Xsize + Ysize * Ysize) * dVar2;
  ChBody::SetInertiaXX(&this->super_ChBody,(ChVector<double> *)&local_b0);
  if ((int)CONCAT71(in_register_00000011,collide) != 0) {
    if ((material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
        == (element_type *)0x0) {
      __assert_fail("material",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChBodyEasy.cpp"
                    ,0xdc,
                    "void chrono::ChBodyEasyBox::SetupBody(double, double, double, double, bool, bool, std::shared_ptr<ChMaterialSurface>)"
                   );
    }
    psVar1 = &(this->super_ChBody).collision_model;
    std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
               &local_b0,
               &psVar1->
                super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>)
    ;
    (**(code **)(*local_b0._vptr_ChFrame + 0x18))();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b0.coord);
    std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
               &local_f8,
               &psVar1->
                super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>)
    ;
    std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_118,
               &material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)
    ;
    local_d8.m_data[2] = 0.0;
    local_d8.m_data[0] = 0.0;
    local_d8.m_data[1] = 0.0;
    ChMatrix33<double>::ChMatrix33((ChMatrix33<double> *)&local_b0,1.0);
    (*(*(_func_int ***)local_f8.m_data[0])[7])
              (Xsize * 0.5,Ysize * 0.5,Zsize * 0.5,local_f8.m_data[0],&local_118,&local_d8,&local_b0
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_118._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f8.m_data + 1));
    std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
               &local_b0,
               &psVar1->
                super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>)
    ;
    (**(code **)(*local_b0._vptr_ChFrame + 0x20))();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b0.coord);
    ChBody::SetCollide(&this->super_ChBody,true);
  }
  if (visualize) {
    chrono_types::make_shared<chrono::ChBoxShape,_0>();
    auVar5._8_8_ = in_XMM0_Qb;
    auVar5._0_8_ = Xsize;
    auVar4._8_8_ = in_XMM1_Qb;
    auVar4._0_8_ = Ysize;
    auVar5 = vunpcklpd_avx(auVar5,auVar4);
    auVar3._8_8_ = 0x3fe0000000000000;
    auVar3._0_8_ = 0x3fe0000000000000;
    auVar5 = vmulpd_avx512vl(auVar5,auVar3);
    *(undefined1 (*) [16])
     ((vshape.super___shared_ptr<chrono::ChBoxShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->gbox).Size
     .m_data = auVar5;
    ((vshape.super___shared_ptr<chrono::ChBoxShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->gbox).Size.
    m_data[2] = Zsize * 0.5;
    std::make_shared<chrono::ChVisualModel>();
    std::__shared_ptr<chrono::ChVisualShape,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<chrono::ChBoxShape,void>
              ((__shared_ptr<chrono::ChVisualShape,(__gnu_cxx::_Lock_policy)2> *)&local_138,
               &vshape.super___shared_ptr<chrono::ChBoxShape,_(__gnu_cxx::_Lock_policy)2>);
    local_d8.m_data[0] = 1.0;
    local_f8.m_data[2] = 0.0;
    local_d8.m_data[3] = 0.0;
    local_f8.m_data[0] = 0.0;
    local_f8.m_data[1] = 0.0;
    local_d8.m_data[1] = 0.0;
    local_d8.m_data[2] = 0.0;
    ChFrame<double>::ChFrame(&local_b0,&local_f8,&local_d8);
    ChVisualModel::AddShape
              (vmodel.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &local_138,&local_b0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_138.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_108,
               &vmodel.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>);
    ChPhysicsItem::AddVisualModel
              ((ChPhysicsItem *)this,(shared_ptr<chrono::ChVisualModel> *)&local_108);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_108._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&vmodel.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&vshape.super___shared_ptr<chrono::ChBoxShape,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  return;
}

Assistant:

void ChBodyEasyBox::SetupBody(double Xsize,
                              double Ysize,
                              double Zsize,
                              double density,
                              bool visualize,
                              bool collide,
                              std::shared_ptr<ChMaterialSurface> material) {
    double mmass = density * (Xsize * Ysize * Zsize);

    this->SetDensity((float)density);
    this->SetMass(mmass);
    this->SetInertiaXX(ChVector<>((1.0 / 12.0) * mmass * (pow(Ysize, 2) + pow(Zsize, 2)),
                                  (1.0 / 12.0) * mmass * (pow(Xsize, 2) + pow(Zsize, 2)),
                                  (1.0 / 12.0) * mmass * (pow(Xsize, 2) + pow(Ysize, 2))));
    if (collide) {
        assert(material);
        GetCollisionModel()->ClearModel();
        GetCollisionModel()->AddBox(material, Xsize * 0.5, Ysize * 0.5, Zsize * 0.5);
        GetCollisionModel()->BuildModel();
        SetCollide(true);
    }
    if (visualize) {
        auto vshape = chrono_types::make_shared<ChBoxShape>();
        vshape->GetBoxGeometry().SetLengths(ChVector<>(Xsize, Ysize, Zsize));
        auto vmodel = chrono_types::make_shared<ChVisualModel>();
        vmodel->AddShape(vshape);
        this->AddVisualModel(vmodel);
    }
}